

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall FInterpolator::ClearInterpolations(FInterpolator *this)

{
  DInterpolation *pDVar1;
  DInterpolation *q;
  DInterpolation *next;
  DInterpolation *probe;
  FInterpolator *this_local;
  
  next = ::TObjPtr::operator_cast_to_DInterpolation_((TObjPtr *)this);
  TObjPtr<DInterpolation>::operator=(&this->Head,(DInterpolation *)0x0);
  while (next != (DInterpolation *)0x0) {
    pDVar1 = ::TObjPtr::operator_cast_to_DInterpolation_((TObjPtr *)&next->Next);
    q = TObjPtr<DInterpolation>::operator=(&next->Prev,(DInterpolation *)0x0);
    TObjPtr<DInterpolation>::operator=(&next->Next,q);
    (*(next->super_DObject)._vptr_DObject[4])();
    next = pDVar1;
  }
  return;
}

Assistant:

void FInterpolator::ClearInterpolations()
{
	DInterpolation *probe = Head;
	Head = NULL;
	while (probe != NULL)
	{
		DInterpolation *next = probe->Next;
		probe->Next = probe->Prev = NULL;
		probe->Destroy();
		probe = next;
	}
}